

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O0

void idle_1_cb(uv_idle_t *handle)

{
  int iVar1;
  uv_loop_t *loop;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int r;
  uv_idle_t *handle_local;
  
  fprintf(_stderr,"%s","IDLE_1_CB\n");
  fflush(_stderr);
  if (handle == (uv_idle_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x92,"handle","!=","NULL",0,"!=",0);
    abort();
  }
  if ((long)idles_1_active < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,0x93,"idles_1_active",">","0",(long)idles_1_active,">",0);
    abort();
  }
  if (idle_2_is_active == 0) {
    iVar1 = uv_is_closing((uv_handle_t *)&idle_2_handle);
    if (iVar1 == 0) {
      loop = uv_default_loop();
      iVar1 = uv_idle_init(loop,&idle_2_handle);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
                ,0x98,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      iVar1 = uv_idle_start(&idle_2_handle,idle_2_cb);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
                ,0x9a,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      idle_2_is_active = 1;
      idle_2_cb_started = idle_2_cb_started + 1;
    }
  }
  idle_1_cb_called = idle_1_cb_called + 1;
  if (idle_1_cb_called % 5 == 0) {
    iVar1 = uv_idle_stop(handle);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
              ,0xa3,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    idles_1_active = idles_1_active + -1;
  }
  return;
}

Assistant:

static void idle_1_cb(uv_idle_t* handle) {
  int r;

  fprintf(stderr, "%s", "IDLE_1_CB\n");
  fflush(stderr);

  ASSERT_NOT_NULL(handle);
  ASSERT_GT(idles_1_active, 0);

  /* Init idle_2 and make it active */
  if (!idle_2_is_active && !uv_is_closing((uv_handle_t*)&idle_2_handle)) {
    r = uv_idle_init(uv_default_loop(), &idle_2_handle);
    ASSERT_OK(r);
    r = uv_idle_start(&idle_2_handle, idle_2_cb);
    ASSERT_OK(r);
    idle_2_is_active = 1;
    idle_2_cb_started++;
  }

  idle_1_cb_called++;

  if (idle_1_cb_called % 5 == 0) {
    r = uv_idle_stop((uv_idle_t*)handle);
    ASSERT_OK(r);
    idles_1_active--;
  }
}